

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O2

EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
* __thiscall
QuadraticSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
::SolveImpl(EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
            *__return_storage_ptr__,
           QuadraticSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
           *this,Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                 *polynome)

{
  pointer pnVar1;
  pointer pnVar2;
  type_conflict5 tVar3;
  initializer_list<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  __l;
  allocator_type local_289;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_288;
  undefined1 local_268 [16];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *local_258;
  pointer pnStack_250;
  pointer local_248;
  uint auStack_240 [2];
  uint local_238 [2];
  uint auStack_230 [2];
  int local_228;
  bool local_224;
  fpclass_type local_220;
  int32_t iStack_21c;
  uint local_218 [2];
  uint auStack_210 [2];
  uint local_208 [2];
  uint auStack_200 [2];
  uint local_1f8 [2];
  uint auStack_1f0 [2];
  uint local_1e8 [2];
  uint auStack_1e0 [2];
  int local_1d8;
  undefined1 local_1d4;
  fpclass_type local_1d0;
  int32_t iStack_1cc;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  d;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  x2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  x1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  a2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  sqrt_d;
  
  local_248 = (polynome->coeffs).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pnVar2 = local_248 + 2;
  pnVar1 = local_248 + 1;
  local_258 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
               *)CONCAT44(local_258._4_4_,4);
  local_268._0_8_ = pnVar1;
  local_268._8_8_ = pnVar1;
  pnStack_250 = pnVar2;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  ::
  number<boost::multiprecision::detail::minus,boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::detail::expression<boost::multiprecision::detail::multiplies,boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,void,void>
            (&d,(expression<boost::multiprecision::detail::minus,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiplies,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_void,_void>
                 *)local_268,(type *)0x0);
  local_268._0_8_ = local_268._0_8_ & 0xffffffff00000000;
  tVar3 = boost::multiprecision::operator<(&d,(int *)local_268);
  if (!tVar3) {
    SqrtImpl<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
              (&sqrt_d,&d);
    local_268._0_4_ = 2;
    local_268._8_8_ = pnVar2;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
    ::
    number<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>
              (&a2,(expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_268,(type *)0x0);
    local_268._0_8_ = &sqrt_d;
    local_268._8_8_ = pnVar1;
    local_258 = &a2;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
    ::
    number<boost::multiprecision::detail::divides,boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>
              (&x1,(expression<boost::multiprecision::detail::divides,_boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_268,(type *)0x0);
    local_268._0_8_ = &sqrt_d;
    local_268._8_8_ = pnVar1;
    local_258 = &a2;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
    ::
    number<boost::multiprecision::detail::negate,boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,void,void,void>
              (&x2,(expression<boost::multiprecision::detail::negate,_boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,_boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_void,_void,_void>
                    *)local_268,(type *)0x0);
    local_238[0] = x1.m_backend.data._M_elems[0xc];
    local_238[1] = x1.m_backend.data._M_elems[0xd];
    auStack_230[0] = x1.m_backend.data._M_elems[0xe];
    auStack_230[1] = x1.m_backend.data._M_elems[0xf];
    local_248 = (pointer)x1.m_backend.data._M_elems._32_8_;
    auStack_240[0] = x1.m_backend.data._M_elems[10];
    auStack_240[1] = x1.m_backend.data._M_elems[0xb];
    local_258 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                 *)x1.m_backend.data._M_elems._16_8_;
    pnStack_250 = (pointer)x1.m_backend.data._M_elems._24_8_;
    local_268._0_4_ = x1.m_backend.data._M_elems[0];
    local_268._4_4_ = x1.m_backend.data._M_elems[1];
    local_268._8_4_ = x1.m_backend.data._M_elems[2];
    local_268._12_4_ = x1.m_backend.data._M_elems[3];
    local_228 = x1.m_backend.exp;
    local_224 = x1.m_backend.neg;
    local_220 = x1.m_backend.fpclass;
    iStack_21c = x1.m_backend.prec_elem;
    local_218[0] = x2.m_backend.data._M_elems[0];
    local_218[1] = x2.m_backend.data._M_elems[1];
    auStack_210[0] = x2.m_backend.data._M_elems[2];
    auStack_210[1] = x2.m_backend.data._M_elems[3];
    local_208[0] = x2.m_backend.data._M_elems[4];
    local_208[1] = x2.m_backend.data._M_elems[5];
    auStack_200[0] = x2.m_backend.data._M_elems[6];
    auStack_200[1] = x2.m_backend.data._M_elems[7];
    local_1f8[0] = x2.m_backend.data._M_elems[8];
    local_1f8[1] = x2.m_backend.data._M_elems[9];
    auStack_1f0[0] = x2.m_backend.data._M_elems[10];
    auStack_1f0[1] = x2.m_backend.data._M_elems[0xb];
    local_1e8[0] = x2.m_backend.data._M_elems[0xc];
    local_1e8[1] = x2.m_backend.data._M_elems[0xd];
    auStack_1e0[0] = x2.m_backend.data._M_elems[0xe];
    auStack_1e0[1] = x2.m_backend.data._M_elems[0xf];
    local_1d8 = x2.m_backend.exp;
    local_1d4 = x2.m_backend.neg;
    local_1d0 = x2.m_backend.fpclass;
    iStack_1cc = x2.m_backend.prec_elem;
    __l._M_len = 2;
    __l._M_array = (iterator)local_268;
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
              *)&local_288,__l,&local_289);
    *(pointer *)
     &(__return_storage_ptr__->
      super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
      ).
      super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      ._M_u = local_288._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
             ).
             super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
             .
             super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
             .
             super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
             .
             super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
             .
             super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
             ._M_u + 8) = local_288._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
             ).
             super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
             .
             super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
             .
             super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
             .
             super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
             .
             super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
             ._M_u + 0x10) = local_288._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_288._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~_Vector_base(&local_288);
  }
  else {
    *(undefined4 *)
     &(__return_storage_ptr__->
      super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
      ).
      super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      ._M_u = 0;
  }
  (__return_storage_ptr__->
  super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
  ).
  super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  .
  super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  .
  super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  .
  super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  .
  super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  ._M_index = tVar3;
  return __return_storage_ptr__;
}

Assistant:

EquationSolution<ValueType> SolveImpl(const Polynome<ValueType> &polynome) const override {
        const ValueType &a = polynome.A();
        const ValueType &b = polynome.B();
        const ValueType &c = polynome.C();
        
        ValueType d = b * b - 4 * a * c;
        if (d < 0) {
            return SpecificSolution::kNoRoots;
        }
        
        //ValueType sqrt_d = std::sqrt(static_cast<double>(d));
        ValueType sqrt_d = SqrtImpl(d);
        //todo optimize
        ValueType a2 = 2 * a;
        ValueType x1 = (-b + sqrt_d) / a2;
        ValueType x2 = (-b - sqrt_d) / a2;
        
        return std::vector<ValueType>({x1, x2});
    }